

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_java.cpp
# Opt level: O2

void __thiscall
flatbuffers::java::JavaGenerator::GenEnum(JavaGenerator *this,EnumDef *enum_def,string *code)

{
  Type *type;
  EnumVal *v2;
  JavaGenerator *pJVar1;
  EnumDef *this_00;
  bool bVar2;
  Value *pVVar3;
  uint64_t uVar4;
  pointer ppEVar5;
  EnumVal *pEVar6;
  string local_a8;
  JavaGenerator *local_88;
  IdlNamer *local_80;
  Type local_78;
  EnumDef *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if ((enum_def->super_Definition).generated == false) {
    local_88 = this;
    GenComment(&(enum_def->super_Definition).doc_comment,code,
               (CommentConfig *)(anonymous_namespace)::comment_config,"");
    std::__cxx11::string::append((char *)code);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a8,"private",(allocator<char> *)&local_78);
    pVVar3 = SymbolTable<flatbuffers::Value>::Lookup
                       (&(enum_def->super_Definition).attributes,&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    if (pVVar3 == (Value *)0x0) {
      std::__cxx11::string::append((char *)code);
    }
    local_80 = &local_88->namer_;
    (*(local_88->namer_).super_Namer._vptr_Namer[0xf])(&local_78,local_80,enum_def);
    std::operator+(&local_a8,"final class ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_78);
    std::__cxx11::string::append((string *)code);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::append((char *)code);
    (*(local_80->super_Namer)._vptr_Namer[0xf])(&local_50,local_80,enum_def);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_78,
                   "  private ",&local_50);
    std::operator+(&local_a8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_78,
                   "() { }\n");
    std::__cxx11::string::append((string *)code);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_50);
    type = &enum_def->underlying_type;
    local_58 = enum_def;
    for (ppEVar5 = (enum_def->vals).vec.
                   super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        ppEVar5 !=
        (enum_def->vals).vec.
        super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>._M_impl.
        super__Vector_impl_data._M_finish; ppEVar5 = ppEVar5 + 1) {
      pEVar6 = *ppEVar5;
      GenComment(&pEVar6->doc_comment,code,(CommentConfig *)(anonymous_namespace)::comment_config,
                 "  ");
      std::__cxx11::string::append((char *)code);
      pJVar1 = local_88;
      DestinationType(&local_78,local_88,type,false);
      GenTypeBasic_abi_cxx11_(&local_a8,pJVar1,&local_78);
      std::__cxx11::string::append((string *)code);
      std::__cxx11::string::~string((string *)&local_a8);
      std::__cxx11::string::append((char *)code);
      (*(local_80->super_Namer)._vptr_Namer[0x13])(&local_78,local_80,pEVar6);
      std::operator+(&local_a8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_78,
                     " = ");
      std::__cxx11::string::append((string *)code);
      enum_def = local_58;
      std::__cxx11::string::~string((string *)&local_a8);
      std::__cxx11::string::~string((string *)&local_78);
      EnumDef::ToString_abi_cxx11_(&local_a8,enum_def,pEVar6);
      std::__cxx11::string::append((string *)code);
      std::__cxx11::string::~string((string *)&local_a8);
      if (type->base_type - BASE_TYPE_LONG < 2) {
        std::__cxx11::string::append((char *)code);
      }
      std::__cxx11::string::append((char *)code);
    }
    uVar4 = EnumDef::Distance(enum_def);
    pJVar1 = local_88;
    if (uVar4 / (ulong)((long)(enum_def->vals).vec.
                              super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(enum_def->vals).vec.
                              super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 3) < 5) {
      DestinationType(&local_78,local_88,type,false);
      GenTypeBasic_abi_cxx11_(&local_a8,pJVar1,&local_78);
      bVar2 = std::operator!=(&local_a8,"long");
      std::__cxx11::string::~string((string *)&local_a8);
      if (bVar2) {
        std::__cxx11::string::append((char *)code);
        std::__cxx11::string::append((char *)code);
        ppEVar5 = (enum_def->vals).vec.
                  super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pEVar6 = *ppEVar5;
        for (; this_00 = local_58,
            ppEVar5 !=
            (local_58->vals).vec.
            super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
            _M_impl.super__Vector_impl_data._M_finish; ppEVar5 = ppEVar5 + 1) {
          v2 = *ppEVar5;
          for (uVar4 = EnumDef::Distance(local_58,pEVar6,v2); 1 < uVar4; uVar4 = uVar4 - 1) {
            std::__cxx11::string::append((char *)code);
          }
          (*(local_80->super_Namer)._vptr_Namer[0x13])(&local_50,local_80,v2);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_78,"\"",&local_50);
          std::operator+(&local_a8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_78,"\", ");
          std::__cxx11::string::append((string *)code);
          std::__cxx11::string::~string((string *)&local_a8);
          std::__cxx11::string::~string((string *)&local_78);
          std::__cxx11::string::~string((string *)&local_50);
          pEVar6 = v2;
        }
        std::__cxx11::string::append((char *)code);
        std::__cxx11::string::append((char *)code);
        std::__cxx11::string::append((char *)code);
        std::__cxx11::string::append((char *)code);
        std::__cxx11::string::append((char *)code);
        pEVar6 = EnumDef::MinValue(this_00);
        if (pEVar6->value != 0) {
          pEVar6 = EnumDef::MinValue(this_00);
          (*(local_88->namer_).super_Namer._vptr_Namer[0x14])
                    (&local_78,local_80,pEVar6,
                     (ulong)(local_88->namer_).super_Namer.config_.variants);
          std::operator+(&local_a8," - ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_78);
          std::__cxx11::string::append((string *)code);
          std::__cxx11::string::~string((string *)&local_a8);
          std::__cxx11::string::~string((string *)&local_78);
        }
        std::__cxx11::string::append((char *)code);
      }
    }
    std::__cxx11::string::append((char *)code);
  }
  return;
}

Assistant:

void GenEnum(EnumDef &enum_def, std::string &code) const {
    if (enum_def.generated) return;

    // Generate enum definitions of the form:
    // public static (final) int name = value;
    // In Java, we use ints rather than the Enum feature, because we want them
    // to map directly to how they're used in C/C++ and file formats.
    // That, and Java Enums are expensive, and not universally liked.
    GenComment(enum_def.doc_comment, &code, &comment_config);

    code += "@SuppressWarnings(\"unused\")\n";
    if (enum_def.attributes.Lookup("private")) {
      // For Java, we leave the enum unmarked to indicate package-private
    } else {
      code += "public ";
    }
    code += "final class " + namer_.Type(enum_def);
    code += " {\n";
    code += "  private " + namer_.Type(enum_def) + "() { }\n";
    for (auto it = enum_def.Vals().begin(); it != enum_def.Vals().end(); ++it) {
      auto &ev = **it;
      GenComment(ev.doc_comment, &code, &comment_config, "  ");
      code += "  public static final ";
      code += GenTypeBasic(DestinationType(enum_def.underlying_type, false));
      code += " ";
      code += namer_.Variant(ev) + " = ";
      code += enum_def.ToString(ev);
      if (enum_def.underlying_type.base_type == BASE_TYPE_LONG ||
          enum_def.underlying_type.base_type == BASE_TYPE_ULONG) {
        code += "L";
      }
      code += ";\n";
    }

    // Generate a string table for enum values.
    // Problem is, if values are very sparse that could generate really big
    // tables. Ideally in that case we generate a map lookup instead, but for
    // the moment we simply don't output a table at all.
    auto range = enum_def.Distance();
    // Average distance between values above which we consider a table
    // "too sparse". Change at will.
    static const uint64_t kMaxSparseness = 5;
    if (range / static_cast<uint64_t>(enum_def.size()) < kMaxSparseness &&
        GenTypeBasic(DestinationType(enum_def.underlying_type, false)) !=
            "long") {
      code += "\n  public static final String";
      code += "[] names = { ";
      const EnumVal *prev = enum_def.Vals().front();
      for (auto it = enum_def.Vals().begin(); it != enum_def.Vals().end();
           ++it) {
        const EnumVal &ev = **it;
        for (auto k = enum_def.Distance(prev, &ev); k > 1; --k)
          code += "\"\", ";
        prev = &ev;
        code += "\"" + namer_.Variant(ev) + "\", ";
      }
      code += "};\n\n";
      code += "  public static ";
      code += "String";
      code += " name";
      code += "(int e) { return names[e";
      if (enum_def.MinValue()->IsNonZero())
        code += " - " + namer_.Variant(enum_def.MinValue()->name);
      code += "]; }\n";
    }

    // Close the class
    code += "}\n\n";
  }